

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canvas_drawing.h
# Opt level: O0

void dlib::fill_rect_with_vertical_gradient<dlib::rgb_alpha_pixel>
               (canvas *c,rectangle *rect,rgb_alpha_pixel *pixel_top,rgb_alpha_pixel *pixel_bottom,
               rectangle *area_)

{
  long *plVar1;
  long lVar2;
  rectangle *in_RSI;
  canvas *in_RDI;
  long x;
  long b;
  long t;
  long y;
  long s;
  rgb_alpha_pixel pixel;
  rectangle area;
  rgb_alpha_pixel *in_stack_fffffffffffffea8;
  canvas *in_stack_fffffffffffffeb0;
  pixel *in_stack_fffffffffffffeb8;
  matrix_exp<dlib::matrix_mul_scal_exp<dlib::matrix<long,_4L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_true>_>
  *in_stack_fffffffffffffec0;
  matrix_exp<dlib::matrix_mul_scal_exp<dlib::matrix<long,_4L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_true>_>
  *in_stack_fffffffffffffec8;
  rectangle *in_stack_fffffffffffffed8;
  rgb_alpha_pixel *prVar3;
  rectangle *in_stack_fffffffffffffee0;
  matrix_exp<dlib::matrix_mul_scal_exp<dlib::matrix<long,_4L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_true>_>
  *local_118;
  rgb_alpha_pixel *local_80;
  rgb_alpha_pixel local_6c [9];
  rectangle local_48;
  rectangle *local_10;
  canvas *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  rectangle::intersect(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  rectangle::intersect(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  rgb_alpha_pixel::rgb_alpha_pixel(local_6c);
  rectangle::bottom(local_10);
  rectangle::top(local_10);
  plVar1 = rectangle::top(&local_48);
  local_80 = (rgb_alpha_pixel *)*plVar1;
  while( true ) {
    prVar3 = local_80;
    plVar1 = rectangle::bottom(&local_48);
    if (*plVar1 < (long)prVar3) break;
    rectangle::bottom(local_10);
    rectangle::top(local_10);
    pixel_to_vector<long,dlib::rgb_alpha_pixel>((rgb_alpha_pixel *)in_stack_fffffffffffffeb8);
    operator*((matrix_exp<dlib::matrix<long,_4L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>
               *)in_stack_fffffffffffffec8,(long *)in_stack_fffffffffffffec0);
    pixel_to_vector<long,dlib::rgb_alpha_pixel>((rgb_alpha_pixel *)in_stack_fffffffffffffeb8);
    operator*((matrix_exp<dlib::matrix<long,_4L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>
               *)in_stack_fffffffffffffec8,(long *)in_stack_fffffffffffffec0);
    operator+(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    operator/((matrix_exp<dlib::matrix_add_exp<dlib::matrix_mul_scal_exp<dlib::matrix<long,_4L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_true>,_dlib::matrix_mul_scal_exp<dlib::matrix<long,_4L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_true>_>_>
               *)in_stack_fffffffffffffec8,(long *)in_stack_fffffffffffffec0);
    vector_to_pixel<dlib::rgb_alpha_pixel,dlib::matrix_div_scal_exp<dlib::matrix_add_exp<dlib::matrix_mul_scal_exp<dlib::matrix<long,4l,1l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>,true>,dlib::matrix_mul_scal_exp<dlib::matrix<long,4l,1l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>,true>>>>
              ((rgb_alpha_pixel *)in_stack_fffffffffffffeb0,
               (matrix_exp<dlib::matrix_div_scal_exp<dlib::matrix_add_exp<dlib::matrix_mul_scal_exp<dlib::matrix<long,_4L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_true>,_dlib::matrix_mul_scal_exp<dlib::matrix<long,_4L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_true>_>_>_>
                *)in_stack_fffffffffffffea8);
    plVar1 = rectangle::left(&local_48);
    local_118 = (matrix_exp<dlib::matrix_mul_scal_exp<dlib::matrix<long,_4L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>,_true>_>
                 *)*plVar1;
    while( true ) {
      in_stack_fffffffffffffec8 = local_118;
      plVar1 = rectangle::right(&local_48);
      if (*plVar1 < (long)in_stack_fffffffffffffec8) break;
      in_stack_fffffffffffffea8 = local_80;
      in_stack_fffffffffffffeb0 = local_8;
      lVar2 = rectangle::top(&local_8->super_rectangle);
      in_stack_fffffffffffffeb8 =
           canvas::operator[](in_stack_fffffffffffffeb0,(long)in_stack_fffffffffffffea8 - lVar2);
      in_stack_fffffffffffffec0 = local_118;
      rectangle::left(&local_8->super_rectangle);
      assign_pixel<dlib::canvas::pixel,dlib::rgb_alpha_pixel>
                ((pixel *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      local_118 = local_118 + 1;
    }
    local_80 = (rgb_alpha_pixel *)&local_80->green;
  }
  return;
}

Assistant:

void fill_rect_with_vertical_gradient (
        const canvas& c,
        const rectangle& rect,
        const pixel_type& pixel_top,
        const pixel_type& pixel_bottom,
        const rectangle& area_ = rectangle(std::numeric_limits<long>::min(), std::numeric_limits<long>::min(),
                                          std::numeric_limits<long>::max(), std::numeric_limits<long>::max())
    )
    {
        rectangle area = rect.intersect(c).intersect(area_);
        pixel_type pixel;

        const long s = rect.bottom()-rect.top();

        for (long y = area.top(); y <= area.bottom(); ++y)
        {
            const long t = rect.bottom()-y;
            const long b = y-rect.top();
            vector_to_pixel(pixel,
                    ((pixel_to_vector<long>(pixel_top)*t + 
                      pixel_to_vector<long>(pixel_bottom)*b)/s));

            for (long x = area.left(); x <= area.right(); ++x)
            {
                assign_pixel(c[y-c.top()][x-c.left()], pixel);
            }
        }
    }